

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::concat<kj::String,kj::StringPtr&,kj::String>
          (String *__return_storage_ptr__,_ *this,String *params,StringPtr *params_1,
          String *params_2)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  char *target;
  
  lVar2 = *(long *)(this + 8) + -1;
  if (*(long *)(this + 8) == 0) {
    lVar2 = 0;
  }
  sVar1 = (params_1->content).size_;
  lVar3 = sVar1 - 1;
  if (sVar1 == 0) {
    lVar3 = 0;
  }
  heapString(__return_storage_ptr__,(lVar3 + lVar2 + (params->content).size_) - 1);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::String,kj::StringPtr&,kj::String>
            (target,(String *)this,(StringPtr *)params,(String *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}